

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::localize_global_variables(CompilerMSL *this)

{
  uint uVar1;
  StorageClass SVar2;
  bool bVar3;
  ExecutionModel EVar4;
  SPIRFunction *pSVar5;
  SPIRVariable *var;
  size_t sVar6;
  size_t __n;
  uint *__dest;
  
  pSVar5 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if ((this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
      buffer_size != 0) {
    __dest = (this->super_CompilerGLSL).super_Compiler.global_variables.
             super_VectorView<unsigned_int>.ptr;
    do {
      uVar1 = *__dest;
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar1);
      SVar2 = var->storage;
      if ((int)SVar2 < 6) {
        if (SVar2 == StorageClassOutput) {
          EVar4 = Compiler::get_execution_model((Compiler *)this);
          if (EVar4 == ExecutionModelMeshEXT) goto LAB_001f1d82;
        }
        else if (SVar2 == StorageClassWorkgroup) goto LAB_001f1d62;
LAB_001f1dea:
        __dest = __dest + 1;
        sVar6 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                super_VectorView<unsigned_int>.buffer_size;
      }
      else {
        if ((SVar2 != StorageClassTaskPayloadWorkgroupEXT) && (SVar2 != StorageClassPrivate))
        goto LAB_001f1dea;
LAB_001f1d62:
        bVar3 = CompilerGLSL::variable_is_lut(&this->super_CompilerGLSL,var);
        if (!bVar3) {
LAB_001f1d82:
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                    (&pSVar5->local_variables,
                     (pSVar5->local_variables).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1)
          ;
          sVar6 = (pSVar5->local_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
          (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          ptr[sVar6].id = uVar1;
          (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          buffer_size = sVar6 + 1;
        }
        sVar6 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                super_VectorView<unsigned_int>.buffer_size;
        __n = (long)(this->super_CompilerGLSL).super_Compiler.global_variables.
                    super_VectorView<unsigned_int>.ptr + (sVar6 * 4 - (long)(__dest + 1));
        if (__n != 0) {
          memmove(__dest,__dest + 1,__n);
          sVar6 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                  super_VectorView<unsigned_int>.buffer_size;
        }
        sVar6 = sVar6 - 1;
        (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
        buffer_size = sVar6;
      }
    } while (__dest != (this->super_CompilerGLSL).super_Compiler.global_variables.
                       super_VectorView<unsigned_int>.ptr + sVar6);
  }
  return;
}

Assistant:

void CompilerMSL::localize_global_variables()
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto iter = global_variables.begin();
	while (iter != global_variables.end())
	{
		uint32_t v_id = *iter;
		auto &var = get<SPIRVariable>(v_id);
		if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup ||
		    var.storage == StorageClassTaskPayloadWorkgroupEXT)
		{
			if (!variable_is_lut(var))
				entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else if (var.storage == StorageClassOutput && is_mesh_shader())
		{
			entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else
			iter++;
	}
}